

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restore.c
# Opt level: O2

void inven_inuse(boolean quietly)

{
  obj *poVar1;
  char *pcVar2;
  obj *obj;
  
  poVar1 = invent;
  while (obj = poVar1, obj != (obj *)0x0) {
    poVar1 = obj->nobj;
    if ((obj->field_0x4c & 0x80) != 0) {
      if (quietly == '\0') {
        pcVar2 = xname(obj);
        pline("Finishing off %s...",pcVar2);
      }
      useup(obj);
    }
  }
  return;
}

Assistant:

void inven_inuse(boolean quietly)
{
	struct obj *otmp, *otmp2;

	for (otmp = invent; otmp; otmp = otmp2) {
	    otmp2 = otmp->nobj;
	    if (otmp->in_use) {
		if (!quietly) pline("Finishing off %s...", xname(otmp));
		useup(otmp);
	    }
	}
}